

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t insertion_length,size_t indent_length)

{
  GeneratorContextImpl *pGVar1;
  bool bVar2;
  bool bVar3;
  int32_t iVar4;
  AlphaNum *pAVar5;
  ostream *poVar6;
  pointer ppVar7;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *pRVar8;
  reference this_00;
  GeneratedCodeInfo_Annotation *this_01;
  iterator iVar9;
  string_view input;
  bool local_2c1;
  Annotation *annotation;
  GeneratedCodeInfo_Annotation *source_annotation;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *__range2;
  size_t to_add;
  undefined1 local_250 [7];
  bool crossed_offset;
  GeneratedCodeInfo new_metadata;
  AlphaNum local_1f0;
  string local_1c0;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  local_1a0;
  undefined4 local_184;
  undefined1 local_180 [16];
  string_view local_170;
  AlphaNum *local_160;
  int local_158;
  iterator local_150;
  string *local_140;
  string *encoded_data;
  undefined1 local_130 [7];
  bool is_text_format;
  GeneratedCodeInfo metadata;
  iterator local_f0;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *local_e0;
  int local_d8;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  undefined1 local_40 [8];
  iterator it;
  size_t indent_length_local;
  size_t insertion_length_local;
  size_t insertion_offset_local;
  string *insertion_content_local;
  MemoryOutputStream *this_local;
  
  pGVar1 = this->directory_;
  pAVar5 = (AlphaNum *)insertion_length;
  it._8_8_ = indent_length;
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_90,&this->filename_);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,".pb.meta");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_60,(lts_20250127 *)&local_90,&local_c0,pAVar5);
  iVar9 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>>
          ::find<std::__cxx11::string>
                    ((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>>
                      *)&pGVar1->files_,&local_60);
  local_e0 = iVar9.node_;
  local_d8 = iVar9.position_;
  local_40 = (undefined1  [8])local_e0;
  it.node_._0_4_ = local_d8;
  std::__cxx11::string::~string((string *)&local_60);
  iVar9 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
                 *)&this->directory_->files_);
  metadata.field_0._24_8_ = iVar9.node_;
  local_f0.position_ = iVar9.position_;
  local_f0.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
        *)metadata.field_0._24_8_;
  bVar2 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
          ::operator==((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                        *)local_40,&local_f0);
  local_2c1 = false;
  if (bVar2) {
    pRVar8 = GeneratedCodeInfo::annotation(&this->info_to_insert_);
    local_2c1 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::empty(pRVar8);
  }
  if (local_2c1 != false) {
    return;
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_130);
  encoded_data._7_1_ = 0;
  local_140 = (string *)0x0;
  iVar9 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
                 *)&this->directory_->files_);
  pAVar5 = (AlphaNum *)iVar9.node_;
  local_158 = iVar9.position_;
  local_160 = pAVar5;
  local_150.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
        *)pAVar5;
  local_150.position_ = local_158;
  bVar2 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
          ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                        *)local_40,&local_150);
  if (bVar2) {
    ppVar7 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
             ::operator->((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                           *)local_40);
    local_140 = &ppVar7->second;
    local_170 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_140);
    bVar2 = MessageLite::ParseFromString((MessageLite *)local_130,local_170);
    if (!bVar2) {
      local_180 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_140);
      input._M_str = local_130;
      input._M_len = local_180._8_8_;
      bVar2 = TextFormat::ParseFromString(local_180._0_8_,input,(Message *)pAVar5);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
        poVar6 = std::operator<<(poVar6,".pb.meta: Could not parse metadata as wire or text format."
                                );
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_184 = 1;
        goto LAB_0024b22e;
      }
      encoded_data._7_1_ = 1;
    }
  }
  else {
    pGVar1 = this->directory_;
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1f0,&this->filename_);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)&new_metadata.field_0._impl_._cached_size_,".pb.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_1c0,(lts_20250127 *)&local_1f0,
               (AlphaNum *)&new_metadata.field_0._impl_._cached_size_,pAVar5);
    absl::lts_20250127::container_internal::
    btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
    ::
    try_emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[1],_0>
              (&local_1a0,
               &(pGVar1->files_).
                super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>_>
               ,&local_1c0,(char (*) [1])0x718c70);
    ppVar7 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
             ::operator->(&local_1a0.first);
    local_140 = &ppVar7->second;
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_250);
  bVar2 = false;
  __range2 = (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)0x0;
  pRVar8 = GeneratedCodeInfo::annotation((GeneratedCodeInfo *)local_130);
  __end2 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::begin(pRVar8);
  source_annotation =
       (GeneratedCodeInfo_Annotation *)
       RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::end(pRVar8);
  while( true ) {
    bVar3 = internal::operator!=(&__end2,(iterator *)&source_annotation);
    if (!bVar3) break;
    this_00 = internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::
              operator*(&__end2);
    iVar4 = GeneratedCodeInfo_Annotation::begin(this_00);
    if ((insertion_offset <= (ulong)(long)iVar4) && (!bVar2)) {
      bVar2 = true;
      InsertShiftedInfo(this,insertion_content,insertion_offset,it._8_8_,
                        (GeneratedCodeInfo *)local_250);
      __range2 = (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
                 ((long)&(__range2->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                 insertion_length);
    }
    this_01 = GeneratedCodeInfo::add_annotation((GeneratedCodeInfo *)local_250);
    GeneratedCodeInfo_Annotation::operator=(this_01,this_00);
    iVar4 = GeneratedCodeInfo_Annotation::begin(this_01);
    GeneratedCodeInfo_Annotation::set_begin(this_01,iVar4 + (int)__range2);
    iVar4 = GeneratedCodeInfo_Annotation::end(this_01);
    GeneratedCodeInfo_Annotation::set_end(this_01,iVar4 + (int)__range2);
    internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::operator++
              (&__end2);
  }
  if (!bVar2) {
    InsertShiftedInfo(this,insertion_content,insertion_offset,it._8_8_,
                      (GeneratedCodeInfo *)local_250);
  }
  if ((encoded_data._7_1_ & 1) == 0) {
    MessageLite::SerializeToString((MessageLite *)local_250,local_140);
  }
  else {
    TextFormat::PrintToString((Message *)local_250,local_140);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_250);
  local_184 = 0;
LAB_0024b22e:
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_130);
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    const std::string& insertion_content, size_t insertion_offset,
    size_t insertion_length, size_t indent_length) {
  auto it = directory_->files_.find(absl::StrCat(filename_, ".pb.meta"));
  if (it == directory_->files_.end() && info_to_insert_.annotation().empty()) {
    // No metadata was recorded for this file.
    return;
  }
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  std::string* encoded_data = nullptr;
  if (it != directory_->files_.end()) {
    encoded_data = &it->second;
    // Try to decode a GeneratedCodeInfo proto from the .pb.meta file. It may be
    // in wire or text format. Keep the same format when the data is written out
    // later.
    if (!metadata.ParseFromString(*encoded_data)) {
      if (!TextFormat::ParseFromString(*encoded_data, &metadata)) {
        // The metadata is invalid.
        std::cerr
            << filename_
            << ".pb.meta: Could not parse metadata as wire or text format."
            << std::endl;
        return;
      }
      // Generators that use the public plugin interface emit text-format
      // metadata (because in the public plugin protocol, file content must be
      // UTF8-encoded strings).
      is_text_format = true;
    }
  } else {
    // Create a new file to store the new metadata in info_to_insert_.
    encoded_data =
        &directory_->files_.try_emplace(absl::StrCat(filename_, ".pb.meta"), "")
             .first->second;
  }
  GeneratedCodeInfo new_metadata;
  bool crossed_offset = false;
  size_t to_add = 0;
  for (const auto& source_annotation : metadata.annotation()) {
    // The first time an annotation at or after the insertion point is found,
    // insert the new metadata from info_to_insert_. Shift all annotations
    // after the new metadata by the length of the text that was inserted
    // (including any additional indent length).
    if (static_cast<size_t>(source_annotation.begin()) >= insertion_offset &&
        !crossed_offset) {
      crossed_offset = true;
      InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                        new_metadata);
      to_add += insertion_length;
    }
    GeneratedCodeInfo::Annotation* annotation = new_metadata.add_annotation();
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + to_add);
    annotation->set_end(annotation->end() + to_add);
  }
  // If there were never any annotations at or after the insertion point,
  // make sure to still insert the new metadata from info_to_insert_.
  if (!crossed_offset) {
    InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                      new_metadata);
  }
  if (is_text_format) {
    TextFormat::PrintToString(new_metadata, encoded_data);
  } else {
    new_metadata.SerializeToString(encoded_data);
  }
}